

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O0

void __thiscall libtorrent::aux::peer_connection::update_desired_queue_size(peer_connection *this)

{
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  element_type *this_00;
  undefined1 local_38 [4];
  int bs;
  shared_ptr<libtorrent::aux::torrent> t;
  int queue_time;
  int download_rate;
  int previous_queue_size;
  peer_connection *this_local;
  
  if (((byte)(this->super_peer_connection_hot_members).field_0x28 >> 3 & 1) == 0) {
    uVar1 = this->m_desired_queue_size;
    iVar2 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])();
    iVar2 = stat::download_payload_rate((stat *)CONCAT44(extraout_var,iVar2));
    t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = session_settings::get_int((this->super_peer_connection_hot_members).m_settings,0x4006);
    if (((byte)this->field_0x887 >> 5 & 1) == 0) {
      ::std::weak_ptr<libtorrent::aux::torrent>::lock
                ((weak_ptr<libtorrent::aux::torrent> *)local_38);
      this_00 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_38);
      iVar3 = torrent::block_size(this_00);
      this->m_desired_queue_size =
           (uint16_t)
           ((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._4_4_ * iVar2) / iVar3);
      ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                ((shared_ptr<libtorrent::aux::torrent> *)local_38);
    }
    if (this->m_max_out_request_queue < this->m_desired_queue_size) {
      this->m_desired_queue_size = this->m_max_out_request_queue;
    }
    if (this->m_desired_queue_size < 2) {
      this->m_desired_queue_size = 2;
    }
    if (uVar1 != this->m_desired_queue_size) {
      peer_log(this,info,"UPDATE_QUEUE_SIZE",
               "dqs: %d max: %d dl: %d qt: %d snubbed: %d slow-start: %d",
               (ulong)this->m_desired_queue_size,(ulong)this->m_max_out_request_queue,iVar2,
               t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               (uint)((byte)(this->super_peer_connection_hot_members).field_0x28 >> 3 & 1),
               (uint)((byte)this->field_0x887 >> 5 & 1));
    }
  }
  else {
    this->m_desired_queue_size = 1;
  }
  return;
}

Assistant:

void peer_connection::update_desired_queue_size()
	{
		TORRENT_ASSERT(is_single_thread());
		if (m_snubbed)
		{
			m_desired_queue_size = 1;
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		int const previous_queue_size = m_desired_queue_size;
#endif

		int const download_rate = statistics().download_payload_rate();

		// the desired download queue size
		int const queue_time = m_settings.get_int(settings_pack::request_queue_time);

		// when we're in slow-start mode we increase the desired queue size every
		// time we receive a piece, no need to adjust it here (other than
		// enforcing the upper limit)
		if (!m_slow_start)
		{
			// (if the latency is more than this, the download will stall)
			// so, the queue size is queue_time * down_rate / 16 kiB
			// (16 kB is the size of each request)
			// the minimum number of requests is 2 and the maximum is 48
			// the block size doesn't have to be 16. So we first query the
			// torrent for it
			auto t = m_torrent.lock();
			int const bs = t->block_size();

			TORRENT_ASSERT(bs > 0);

			m_desired_queue_size = std::uint16_t(queue_time * download_rate / bs);
		}

		if (m_desired_queue_size > m_max_out_request_queue)
			m_desired_queue_size = m_max_out_request_queue;
		if (m_desired_queue_size < min_request_queue)
			m_desired_queue_size = min_request_queue;

#ifndef TORRENT_DISABLE_LOGGING
		if (previous_queue_size != m_desired_queue_size)
		{
			peer_log(peer_log_alert::info, "UPDATE_QUEUE_SIZE"
				, "dqs: %d max: %d dl: %d qt: %d snubbed: %d slow-start: %d"
				, int(m_desired_queue_size), int(m_max_out_request_queue)
				, download_rate, queue_time, int(m_snubbed), int(m_slow_start));
		}
#endif
	}